

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_size_float(t_array_size *x,t_floatarg f)

{
  t_symbol *s;
  _array *array;
  _garray *x_00;
  int n;
  _glist *glist;
  
  array = array_client_getbuf(&x->x_tc,&glist);
  if (array == (_array *)0x0) {
    return;
  }
  s = (x->x_tc).tc_sym;
  if (s != (t_symbol *)0x0) {
    x_00 = (_garray *)pd_findbyclass(s,garray_class);
    if (x_00 != (_garray *)0x0) {
      garray_resize(x_00,f);
      return;
    }
    pd_error(x,"no such array \'%s\'",((x->x_tc).tc_sym)->s_name);
    return;
  }
  n = 1;
  if (1 < (int)f) {
    n = (int)f;
  }
  array_resize_and_redraw(array,glist,n);
  return;
}

Assistant:

static void array_size_float(t_array_size *x, t_floatarg f)
{
    t_glist *glist;
    t_array *a = array_client_getbuf(&x->x_tc, &glist);
    if (a)
    {
              /* if it's a named array object we have to go back and find the
              garray (repeating work done in array_client_getbuf()) because
              the garray might want to adjust.  Maybe array_client_getbuf
              should have a return slot for the garray if any?  */
        if (x->x_tc.tc_sym)
        {
            t_garray *y = (t_garray *)pd_findbyclass(x->x_tc.tc_sym,
                garray_class);
            if (!y)
            {
                pd_error(x, "no such array '%s'", x->x_tc.tc_sym->s_name);
                return;
            }
            garray_resize(y, f);
        }
        else
        {
            int n = f;
            if (n < 1)
                n = 1;
             array_resize_and_redraw(a, glist, n);
        }
    }
}